

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trees.cpp
# Opt level: O0

vector<unsigned_long,_std::allocator<unsigned_long>_> *
randVec(vector<unsigned_long,_std::allocator<unsigned_long>_> *__return_storage_ptr__,size_t size)

{
  iterator iVar1;
  iterator iVar2;
  allocator<unsigned_long> local_1a;
  undefined1 local_19;
  size_t local_18;
  size_t size_local;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *v;
  
  local_19 = 0;
  local_18 = size;
  size_local = (size_t)__return_storage_ptr__;
  std::allocator<unsigned_long>::allocator(&local_1a);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (__return_storage_ptr__,size,&local_1a);
  std::allocator<unsigned_long>::~allocator(&local_1a);
  iVar1 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin(__return_storage_ptr__);
  iVar2 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end(__return_storage_ptr__);
  std::
  generate<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,randVec(unsigned_long)::__0>
            (iVar1._M_current,iVar2._M_current);
  return __return_storage_ptr__;
}

Assistant:

auto randVec(std::size_t size) {
  std::vector<std::uint64_t> v(size);
  std::generate(v.begin(), v.end(), []() { return utility::get_random(); });
  return v;
}